

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_> * __thiscall
Corrade::Utility::Json::parseUnsignedIntArray
          (Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_>
           *__return_storage_ptr__,Json *this,JsonToken *token,size_t expectedSize)

{
  bool bVar1;
  State *pSVar2;
  JsonToken *pJVar3;
  size_t sVar4;
  ostream *output;
  Type TVar5;
  Debug *pDVar6;
  BasicStringView<const_char> BVar7;
  StridedArrayView1D<const_Corrade::Utility::JsonToken> local_188;
  StridedArrayView<1U,_const_unsigned_int> local_170;
  BasicStringView<const_char> local_150;
  Flags local_139;
  undefined1 local_138 [8];
  Error err_2;
  Flags local_f1;
  undefined1 local_f0 [8];
  Error err_1;
  JsonToken *end;
  JsonToken *i;
  size_t size;
  Flags local_91;
  undefined1 local_90 [8];
  Error err;
  Flags local_51;
  Error local_50;
  JsonToken *local_28;
  size_t expectedSize_local;
  JsonToken *token_local;
  Json *this_local;
  
  local_28 = (JsonToken *)expectedSize;
  expectedSize_local = (size_t)token;
  token_local = (JsonToken *)this;
  this_local = (Json *)__return_storage_ptr__;
  pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
  pJVar3 = Containers::Array::operator_cast_to_JsonToken_((Array *)&pSVar2->tokens);
  pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
  sVar4 = Containers::
          Array<Corrade::Utility::JsonToken,_void_(*)(Corrade::Utility::JsonToken_*,_unsigned_long)>
          ::size(&pSVar2->tokens);
  if (sVar4 <= (ulong)(((long)token - (long)pJVar3) / 0x18)) {
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_51);
    Error::Error(&local_50,output,local_51);
    Debug::operator<<(&local_50.super_Debug,
                      "Utility::Json::parseUnsignedIntArray(): token not owned by the instance");
    Error::~Error(&local_50);
    abort();
  }
  TVar5 = JsonToken::type((JsonToken *)expectedSize_local);
  if (TVar5 == Array) {
    parseObjectArrayInternal(this,(JsonToken *)expectedSize_local);
    pJVar3 = *(JsonToken **)(expectedSize_local + 0x10);
    sVar4 = (long)pJVar3 * 0x18;
    err_1._previousGlobalErrorOutput = (ostream *)(expectedSize_local + 0x18 + sVar4);
    end = (JsonToken *)expectedSize_local;
    do {
      end = end + 1;
      if (end == (JsonToken *)err_1._previousGlobalErrorOutput) {
        if ((local_28 != (JsonToken *)0x0) && (pJVar3 != local_28)) {
          Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                    (&local_139);
          Error::Error((Error *)local_138,local_139);
          pDVar6 = Debug::operator<<((Debug *)local_138,
                                     "Utility::Json::parseUnsignedIntArray(): expected a");
          pDVar6 = Debug::operator<<(pDVar6,(unsigned_long)local_28);
          pDVar6 = Debug::operator<<(pDVar6,Debug::nospace);
          pDVar6 = Debug::operator<<(pDVar6,"-element array, got");
          pDVar6 = Debug::operator<<(pDVar6,(unsigned_long)pJVar3);
          Debug::operator<<(pDVar6,"at");
          pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
          local_150 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                                (&pSVar2->string,*(char **)expectedSize_local);
          printFilePosition(this,(Debug *)local_138,local_150);
          Containers::Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_>::
          Optional(__return_storage_ptr__);
          Error::~Error((Error *)local_138);
          return __return_storage_ptr__;
        }
        Containers::stridedArrayView<Corrade::Utility::JsonToken_const>
                  (&local_188,(Containers *)(expectedSize_local + 0x18),pJVar3,sVar4);
        Containers::StridedArrayView<1U,_const_Corrade::Utility::JsonToken>::
        slice<unsigned_int,_Corrade::Utility::JsonToken,_0>(&local_170,&local_188,0x10);
        Containers::Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_>::
        Optional(__return_storage_ptr__,&local_170);
        return __return_storage_ptr__;
      }
      TVar5 = JsonToken::type(end);
      sVar4 = 0xa000000000000000;
      if (TVar5 != Number) {
        Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                  (&local_f1);
        Error::Error((Error *)local_f0,local_f1);
        pDVar6 = Debug::operator<<((Debug *)local_f0,
                                   "Utility::Json::parseUnsignedIntArray(): expected a number, got")
        ;
        TVar5 = JsonToken::type(end);
        pDVar6 = Utility::operator<<(pDVar6,TVar5);
        Debug::operator<<(pDVar6,"at");
        pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
        BVar7 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                          (&pSVar2->string,end->_data);
        printFilePosition(this,(Debug *)local_f0,BVar7);
        Containers::Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_>::
        Optional(__return_storage_ptr__);
        Error::~Error((Error *)local_f0);
        return __return_storage_ptr__;
      }
      bVar1 = parseUnsignedIntInternal(this,"Utility::Json::parseUnsignedIntArray():",end);
    } while (bVar1);
    Containers::Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_>::Optional
              (__return_storage_ptr__);
  }
  else {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_91);
    Error::Error((Error *)local_90,local_91);
    pDVar6 = Debug::operator<<((Debug *)local_90,
                               "Utility::Json::parseUnsignedIntArray(): expected an array, got");
    TVar5 = JsonToken::type((JsonToken *)expectedSize_local);
    pDVar6 = Utility::operator<<(pDVar6,TVar5);
    Debug::operator<<(pDVar6,"at");
    pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
    BVar7 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                      (&pSVar2->string,*(char **)expectedSize_local);
    printFilePosition(this,(Debug *)local_90,BVar7);
    Containers::Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_>::Optional
              (__return_storage_ptr__);
    Error::~Error((Error *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Containers::Optional<Containers::StridedArrayView1D<const std::uint32_t>> Json::parseUnsignedIntArray(const JsonToken& token, const std::size_t expectedSize) {
    CORRADE_ASSERT(std::size_t(&token - _state->tokens) < _state->tokens.size(),
        "Utility::Json::parseUnsignedIntArray(): token not owned by the instance", {});

    if(token.type() != JsonToken::Type::Array) {
        Error err;
        err << "Utility::Json::parseUnsignedIntArray(): expected an array, got" << token.type() << "at";
        printFilePosition(err, _state->string.prefix(token._data));
        return {};
    }

    parseObjectArrayInternal(const_cast<JsonToken&>(token));
    const std::size_t size =
        #ifndef CORRADE_TARGET_32BIT
        token._childCount
        #else
        token._childCountFlagsTypeNan & JsonToken::ChildCountMask
        #endif
        ;
    /* As this is expected to be a value array, we go by simple incrementing
       instead of with i->next(). If a nested object or array would be
       encountered, the type() check fails. */
    for(const JsonToken *i = &token + 1, *end = &token + 1 + size; i != end; ++i) {
        if(i->type() != JsonToken::Type::Number) {
            Error err;
            err << "Utility::Json::parseUnsignedIntArray(): expected a number, got" << i->type() << "at";
            printFilePosition(err, _state->string.prefix(i->_data));
            return {};
        }

        if(!parseUnsignedIntInternal("Utility::Json::parseUnsignedIntArray():", const_cast<JsonToken&>(*i)))
            return {};
    }

    /* Needs to be after the type-checking loop, otherwise the child count may
       include also nested tokens and the message would be confusing */
    if(expectedSize && size != expectedSize) {
        Error err;
        err << "Utility::Json::parseUnsignedIntArray(): expected a" << expectedSize << Debug::nospace << "-element array, got" << size << "at";
        printFilePosition(err, _state->string.prefix(token._data));
        return {};
    }

    return Containers::stridedArrayView(&token + 1, size).slice(&JsonToken::_parsedUnsignedInt);
}